

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containsmulti_benchmark.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  roaring_bitmap_t *prVar4;
  undefined1 auVar5 [8];
  __time_t _Var6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  FILE *__stream;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  uint32_t *puVar14;
  ulong uVar15;
  uint64_t uVar16;
  long lVar17;
  undefined1 *puVar18;
  ulong uVar19;
  undefined1 *puVar20;
  char cVar21;
  byte bVar22;
  int p_1;
  int iVar23;
  _Bool *p_Var24;
  undefined1 *__n;
  int p;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong uStack_90;
  undefined1 auStack_88 [8];
  undefined1 *local_80;
  undefined1 *local_78;
  ulong local_70;
  char **local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  roaring_bitmap_t *local_50;
  undefined1 *local_48;
  undefined1 local_40 [8];
  timespec ts;
  
  if (argc < 2) {
    uStack_90 = 0x101315;
    printf("Usage: %s <comma_separated_integers_file> ...\n",*argv);
    uStack_90 = 0x101326;
    printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",*argv);
    iVar23 = 1;
  }
  else {
    local_78 = auStack_88;
    local_70 = (ulong)(argc - 1);
    local_80 = (undefined1 *)(ulong)(uint)argc;
    uVar10 = (long)(ulong)(uint)argc * 8 + 0xfU & 0xfffffffffffffff0;
    local_58 = auStack_88 + -uVar10;
    puVar18 = auStack_88 + -uVar10 + -uVar10;
    local_60 = puVar18;
    *(undefined8 *)(puVar18 + -8) = 1;
    puVar20 = *(undefined1 **)(puVar18 + -8);
    *(undefined8 *)(puVar18 + -8) = 0x10136e;
    local_50 = roaring_bitmap_create();
    __n = puVar20;
    local_68 = argv;
LAB_00101379:
    if (puVar20 != local_80) {
      pcVar1 = local_68[(long)puVar20];
      local_48 = puVar20;
      *(undefined8 *)(puVar18 + -8) = 0x10139a;
      __stream = fopen(pcVar1,"r");
      if (__stream == (FILE *)0x0) {
        *(undefined8 *)(puVar18 + -8) = 0x101a01;
        printf("Could not open file %s\n",pcVar1);
      }
      else {
        *(undefined8 *)(puVar18 + -8) = 2;
        uVar3 = *(undefined8 *)(puVar18 + -8);
        *(undefined8 *)(puVar18 + -8) = 0x1013b3;
        fseek(__stream,0,(int)uVar3);
        *(undefined8 *)(puVar18 + -8) = 0x1013bb;
        sVar11 = ftell(__stream);
        *(undefined8 *)(puVar18 + -8) = 0x1013c6;
        rewind(__stream);
        *(undefined8 *)(puVar18 + -8) = 0x1013d0;
        pvVar12 = malloc(sVar11 + 1);
        if (pvVar12 == (void *)0x0) {
          *(undefined8 *)(puVar18 + -8) = 0x101a0b;
          fclose(__stream);
        }
        else {
          *(undefined8 *)(puVar18 + -8) = 0x1013ed;
          sVar13 = fread(pvVar12,sVar11,(size_t)__n,__stream);
          if (sVar13 == 1) {
            *(undefined1 *)((long)pvVar12 + sVar11) = 0;
            *(undefined8 *)(puVar18 + -8) = 0x101404;
            fclose(__stream);
            uVar10 = 0;
            do {
              if (*(char *)((long)pvVar12 + uVar10) == ',') {
                __n = __n + 1;
              }
              else if (*(char *)((long)pvVar12 + uVar10) == '\0') goto LAB_0010141e;
              uVar10 = uVar10 + 1;
            } while( true );
          }
          *(undefined8 *)(puVar18 + -8) = 0x101a15;
          free(pvVar12);
        }
      }
      goto LAB_00101a15;
    }
    *(undefined8 *)(puVar18 + -8) = 0x101575;
    puts("Data:");
    prVar4 = local_50;
    *(undefined8 *)(puVar18 + -8) = 0x101581;
    uVar16 = roaring_bitmap_get_cardinality(prVar4);
    *(undefined8 *)(puVar18 + -8) = 0x101595;
    printf("  cardinality: %lu\n",uVar16);
    uVar8 = (prVar4->high_low_container).size;
    *(undefined8 *)(puVar18 + -8) = 0x1015a6;
    printf("  buckets: %d\n",(ulong)uVar8);
    *(undefined8 *)(puVar18 + -8) = 0x1015ae;
    uVar7 = roaring_bitmap_minimum(prVar4);
    *(undefined8 *)(puVar18 + -8) = 0x1015bb;
    uVar9 = roaring_bitmap_maximum(prVar4);
    *(undefined8 *)(puVar18 + -8) = 0x1015d0;
    printf("  range: %u-%u\n",(ulong)(uVar7 >> 0x10),(ulong)(uVar9 >> 0x10));
    *(undefined8 *)(puVar18 + -8) = 10;
    uVar3 = *(undefined8 *)(puVar18 + -8);
    *(undefined8 *)(puVar18 + -8) = 0x1015e1;
    printf("Cycles/element: %d\n",uVar3);
    *(undefined8 *)(puVar18 + -8) = 0x1015ef;
    printf("                          roaring_bitmap_contains:");
    for (lVar25 = 0; lVar25 != 10; lVar25 = lVar25 + 1) {
      local_48 = puVar18;
      sVar2 = *(size_t *)(local_60 + lVar25 * 8);
      p_Var24 = (_Bool *)(puVar18 + -(sVar2 + 0xf & 0xfffffffffffffff0));
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      _Var6 = ts.tv_sec;
      auVar5 = local_40;
      prVar4 = local_50;
      puVar14 = *(uint32_t **)(local_58 + lVar25 * 8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      contains_multi_via_contains(prVar4,puVar14,p_Var24,sVar2);
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      lVar17 = ((long)local_40 - (long)auVar5) * 1000000000 + (ts.tv_sec - _Var6);
      auVar26._8_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar26._0_8_ = lVar17;
      auVar26._12_4_ = 0x45300000;
      auVar27._8_4_ = (int)(sVar2 >> 0x20);
      auVar27._0_8_ = sVar2;
      auVar27._12_4_ = 0x45300000;
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      printf(" %10f",((auVar26._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) /
                     ((auVar27._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
      puVar18 = local_48;
    }
    *(undefined8 *)(puVar18 + -8) = 10;
    uVar3 = *(undefined8 *)(puVar18 + -8);
    *(undefined8 *)(puVar18 + -8) = 0x1016cd;
    putchar((int)uVar3);
    *(undefined8 *)(puVar18 + -8) = 0x1016dd;
    printf("                     roaring_bitmap_contains_bulk:");
    puVar20 = puVar18;
    for (lVar25 = 0; lVar25 != 10; lVar25 = lVar25 + 1) {
      local_48 = puVar20;
      sVar2 = *(size_t *)(local_60 + lVar25 * 8);
      p_Var24 = (_Bool *)(puVar20 + -(sVar2 + 0xf & 0xfffffffffffffff0));
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      _Var6 = ts.tv_sec;
      auVar5 = local_40;
      prVar4 = local_50;
      puVar14 = *(uint32_t **)(local_58 + lVar25 * 8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      contains_multi_bulk(prVar4,puVar14,p_Var24,sVar2);
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      lVar17 = ((long)local_40 - (long)auVar5) * 1000000000 + (ts.tv_sec - _Var6);
      auVar28._8_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar28._0_8_ = lVar17;
      auVar28._12_4_ = 0x45300000;
      auVar29._8_4_ = (int)(sVar2 >> 0x20);
      auVar29._0_8_ = sVar2;
      auVar29._12_4_ = 0x45300000;
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      printf(" %10f",((auVar28._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) /
                     ((auVar29._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
      puVar20 = local_48;
    }
    *(undefined8 *)(puVar20 + -8) = 10;
    uVar3 = *(undefined8 *)(puVar20 + -8);
    *(undefined8 *)(puVar20 + -8) = 0x1017bb;
    putchar((int)uVar3);
    *(undefined8 *)(puVar20 + -8) = 4;
    sVar11 = *(size_t *)(puVar20 + -8);
    for (uVar10 = 0; local_70 != uVar10; uVar10 = uVar10 + 1) {
      pvVar12 = *(void **)(local_58 + uVar10 * 8);
      sVar13 = *(size_t *)(local_60 + uVar10 * 8);
      *(undefined8 *)(puVar20 + -8) = 0x1017e9;
      qsort(pvVar12,sVar13,sVar11,compare_uint32);
    }
    *(undefined8 *)(puVar20 + -8) = 0x1017fe;
    printf("        roaring_bitmap_contains with sorted input:");
    for (lVar25 = 0; lVar25 != 10; lVar25 = lVar25 + 1) {
      local_48 = puVar20;
      sVar2 = *(size_t *)(local_60 + lVar25 * 8);
      p_Var24 = (_Bool *)(puVar20 + -(sVar2 + 0xf & 0xfffffffffffffff0));
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      _Var6 = ts.tv_sec;
      auVar5 = local_40;
      prVar4 = local_50;
      puVar14 = *(uint32_t **)(local_58 + lVar25 * 8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      contains_multi_via_contains(prVar4,puVar14,p_Var24,sVar2);
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      lVar17 = ((long)local_40 - (long)auVar5) * 1000000000 + (ts.tv_sec - _Var6);
      auVar30._8_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar30._0_8_ = lVar17;
      auVar30._12_4_ = 0x45300000;
      auVar31._8_4_ = (int)(sVar2 >> 0x20);
      auVar31._0_8_ = sVar2;
      auVar31._12_4_ = 0x45300000;
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      printf(" %10f",((auVar30._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) /
                     ((auVar31._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
      puVar20 = local_48;
    }
    *(undefined8 *)(puVar20 + -8) = 10;
    uVar3 = *(undefined8 *)(puVar20 + -8);
    *(undefined8 *)(puVar20 + -8) = 0x1018dc;
    putchar((int)uVar3);
    *(undefined8 *)(puVar20 + -8) = 0x1018ec;
    printf("   roaring_bitmap_contains_bulk with sorted input:");
    for (lVar25 = 0; lVar25 != 10; lVar25 = lVar25 + 1) {
      local_48 = puVar20;
      sVar2 = *(size_t *)(local_60 + lVar25 * 8);
      p_Var24 = (_Bool *)(puVar20 + -(sVar2 + 0xf & 0xfffffffffffffff0));
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      _Var6 = ts.tv_sec;
      auVar5 = local_40;
      prVar4 = local_50;
      puVar14 = *(uint32_t **)(local_58 + lVar25 * 8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      contains_multi_bulk(prVar4,puVar14,p_Var24,sVar2);
      p_Var24[-8] = true;
      p_Var24[-7] = false;
      p_Var24[-6] = false;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      uVar3 = *(undefined8 *)(p_Var24 + -8);
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      clock_gettime((clockid_t)uVar3,(timespec *)local_40);
      lVar17 = ((long)local_40 - (long)auVar5) * 1000000000 + (ts.tv_sec - _Var6);
      auVar32._8_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar32._0_8_ = lVar17;
      auVar32._12_4_ = 0x45300000;
      auVar33._8_4_ = (int)(sVar2 >> 0x20);
      auVar33._0_8_ = sVar2;
      auVar33._12_4_ = 0x45300000;
      p_Var24[-8] = true;
      p_Var24[-7] = true;
      p_Var24[-6] = true;
      p_Var24[-5] = false;
      p_Var24[-4] = false;
      p_Var24[-3] = false;
      p_Var24[-2] = false;
      p_Var24[-1] = false;
      printf(" %10f",((auVar32._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) /
                     ((auVar33._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
      puVar20 = local_48;
    }
    *(undefined8 *)(puVar20 + -8) = 10;
    uVar3 = *(undefined8 *)(puVar20 + -8);
    *(undefined8 *)(puVar20 + -8) = 0x1019ca;
    putchar((int)uVar3);
    prVar4 = local_50;
    *(undefined8 *)(puVar20 + -8) = 0x1019d3;
    roaring_bitmap_free(prVar4);
    iVar23 = 0;
    for (uVar10 = 0; local_70 != uVar10; uVar10 = uVar10 + 1) {
      pvVar12 = *(void **)(local_58 + uVar10 * 8);
      *(undefined8 *)(puVar20 + -8) = 0x1019eb;
      free(pvVar12);
    }
  }
  return iVar23;
LAB_0010141e:
  *(undefined8 *)(puVar18 + -8) = 0x10142b;
  puVar14 = (uint32_t *)malloc((long)__n * 4);
  if (puVar14 != (uint32_t *)0x0) {
    puVar20 = (undefined1 *)0x0;
    uVar19 = 0;
    while ((uVar19 < uVar10 && (cVar21 = *(char *)((long)pvVar12 + uVar19), cVar21 != '\0'))) {
      uVar15 = uVar19 + 2;
      while ((byte)(cVar21 - 0x3aU) < 0xf6) {
        cVar21 = *(char *)((long)pvVar12 + uVar19 + 1);
        uVar19 = uVar19 + 1;
        uVar15 = uVar15 + 1;
        if (cVar21 == '\0') goto LAB_00101493;
      }
      uVar7 = (uint32_t)(byte)(cVar21 - 0x30);
      while (bVar22 = *(char *)((long)pvVar12 + (uVar15 - 1)) - 0x30, bVar22 < 10) {
        uVar7 = (uint)bVar22 + uVar7 * 10;
        uVar15 = uVar15 + 1;
      }
      puVar14[(long)puVar20] = uVar7;
      puVar20 = puVar20 + 1;
      uVar19 = uVar15;
    }
LAB_00101493:
    if (puVar20 != __n) {
      *(undefined8 *)(puVar18 + -8) = 0x1014ac;
      printf("unexpected number of integers! %d %d \n",(ulong)puVar20 & 0xffffffff,
             (ulong)__n & 0xffffffff);
    }
    *(undefined8 *)(puVar18 + -8) = 0x1014b4;
    free(pvVar12);
    prVar4 = local_50;
    if (puVar20 != (undefined1 *)0x0) {
      *(undefined8 *)(puVar18 + -8) = 0x1014cc;
      roaring_bitmap_add_many(prVar4,(size_t)puVar20,puVar14);
      uVar10 = (ulong)puVar20 & 0xffffffff;
      *(undefined8 *)(puVar18 + -8) = 1;
      __n = *(undefined1 **)(puVar18 + -8);
      while (1 < uVar10) {
        *(undefined8 *)(puVar18 + -8) = 0x1014de;
        uVar7 = pcg32_random();
        uVar19 = (ulong)uVar7;
        uVar8 = (uint)uVar10 - 1;
        if (((uint)uVar10 & uVar8) == 0) {
          uVar19 = (ulong)(uVar7 & uVar8);
        }
        else if (uVar10 < 0x80000001) {
          uVar19 = uVar19 * uVar10;
          if ((uVar19 & 0xffffffff) < uVar10) {
            *(undefined8 *)(puVar18 + -8) = 0xffffffffffffffff;
            uVar15 = *(ulong *)(puVar18 + -8);
            while ((uint)uVar19 <= (uint)((uVar15 & 0xffffffff) % (uVar10 & 0xffffffff))) {
              *(undefined8 *)(puVar18 + -8) = 0x101522;
              uVar7 = pcg32_random();
              uVar19 = uVar7 * uVar10;
            }
          }
          uVar19 = uVar19 >> 0x20;
        }
        else {
          while (uVar10 <= uVar19) {
            *(undefined8 *)(puVar18 + -8) = 0x1014ff;
            uVar7 = pcg32_random();
            uVar19 = (ulong)uVar7;
          }
        }
        uVar10 = uVar10 - 1;
        uVar7 = puVar14[uVar10 & 0xffffffff];
        puVar14[uVar10 & 0xffffffff] = puVar14[uVar19];
        puVar14[uVar19] = uVar7;
      }
      *(uint32_t **)(local_58 + (long)local_48 * 8 + -8) = puVar14;
      *(undefined1 **)(local_60 + (long)local_48 * 8 + -8) = puVar20;
      puVar20 = local_48 + 1;
      goto LAB_00101379;
    }
  }
LAB_00101a15:
  pcVar1 = local_68[(long)local_48];
  *(undefined8 *)(puVar18 + -8) = 0x101a2f;
  printf("No integers found in %s\n",pcVar1);
  *(undefined8 *)(puVar18 + -8) = 1;
  return (int)*(undefined8 *)(puVar18 + -8);
}

Assistant:

int main(int argc, char* argv[]) {
    (void)&read_all_integer_files;  // suppress unused warning

    if (argc < 2) {
        printf("Usage: %s <comma_separated_integers_file> ...\n", argv[0]);
        printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",
               argv[0]);
        return 1;
    }

    size_t fields = argc - 1;
    uint32_t* values[argc];
    size_t count[argc];

    roaring_bitmap_t* bm = roaring_bitmap_create();
    for (int i = 1; i < argc; i++) {
        size_t t_count = 0;
        uint32_t* t_values = read_integer_file(argv[i], &t_count);
        if (t_count == 0) {
            printf("No integers found in %s\n", argv[i]);
            return 1;
        }
        roaring_bitmap_add_many(bm, t_count, t_values);

        shuffle_uint32(t_values, t_count);

        values[i - 1] = t_values;
        count[i - 1] = t_count;
    }
    // roaring_bitmap_run_optimize(bm);

    printf("Data:\n");
    printf("  cardinality: %" PRIu64 "\n", roaring_bitmap_get_cardinality(bm));
    printf("  buckets: %d\n", (int)bm->high_low_container.size);
    printf("  range: %" PRIu32 "-%" PRIu32 "\n",
           roaring_bitmap_minimum(bm) >> 16, roaring_bitmap_maximum(bm) >> 16);

    const int num_passes = 10;
    printf("Cycles/element: %d\n", num_passes);
    uint64_t cycles_start, cycles_final;

    printf("                          roaring_bitmap_contains:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("                     roaring_bitmap_contains_bulk:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    // sort input array
    for (size_t i = 0; i < fields; ++i) {
        qsort(values[i], count[i], sizeof(uint32_t), compare_uint32);
    }

    printf("        roaring_bitmap_contains with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("   roaring_bitmap_contains_bulk with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    roaring_bitmap_free(bm);
    for (size_t i = 0; i < fields; ++i) {
        free(values[i]);
    }
    return 0;
}